

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v3.cpp
# Opt level: O0

void __thiscall
LASreadItemCompressed_WAVEPACKET14_v3::~LASreadItemCompressed_WAVEPACKET14_v3
          (LASreadItemCompressed_WAVEPACKET14_v3 *this)

{
  IntegerCompressor *pIVar1;
  ArithmeticDecoder *this_00;
  uint local_14;
  U32 c;
  LASreadItemCompressed_WAVEPACKET14_v3 *this_local;
  
  (this->super_LASreadItemCompressed).super_LASreadItem._vptr_LASreadItem =
       (_func_int **)&PTR_read_001b02e0;
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    if (this->contexts[local_14].m_packet_index != (ArithmeticModel *)0x0) {
      ArithmeticDecoder::destroySymbolModel
                (this->dec_wavepacket,this->contexts[local_14].m_packet_index);
      ArithmeticDecoder::destroySymbolModel
                (this->dec_wavepacket,this->contexts[local_14].m_offset_diff[0]);
      ArithmeticDecoder::destroySymbolModel
                (this->dec_wavepacket,this->contexts[local_14].m_offset_diff[1]);
      ArithmeticDecoder::destroySymbolModel
                (this->dec_wavepacket,this->contexts[local_14].m_offset_diff[2]);
      ArithmeticDecoder::destroySymbolModel
                (this->dec_wavepacket,this->contexts[local_14].m_offset_diff[3]);
      pIVar1 = this->contexts[local_14].ic_offset_diff;
      if (pIVar1 != (IntegerCompressor *)0x0) {
        IntegerCompressor::~IntegerCompressor(pIVar1);
        operator_delete(pIVar1);
      }
      pIVar1 = this->contexts[local_14].ic_packet_size;
      if (pIVar1 != (IntegerCompressor *)0x0) {
        IntegerCompressor::~IntegerCompressor(pIVar1);
        operator_delete(pIVar1);
      }
      pIVar1 = this->contexts[local_14].ic_return_point;
      if (pIVar1 != (IntegerCompressor *)0x0) {
        IntegerCompressor::~IntegerCompressor(pIVar1);
        operator_delete(pIVar1);
      }
      pIVar1 = this->contexts[local_14].ic_xyz;
      if (pIVar1 != (IntegerCompressor *)0x0) {
        IntegerCompressor::~IntegerCompressor(pIVar1);
        operator_delete(pIVar1);
      }
    }
  }
  if (this->instream_wavepacket != (ByteStreamInArray *)0x0) {
    if (this->instream_wavepacket != (ByteStreamInArray *)0x0) {
      (*(this->instream_wavepacket->super_ByteStreamIn)._vptr_ByteStreamIn[0xe])();
    }
    this_00 = this->dec_wavepacket;
    if (this_00 != (ArithmeticDecoder *)0x0) {
      ArithmeticDecoder::~ArithmeticDecoder(this_00);
      operator_delete(this_00);
    }
  }
  if ((this->bytes != (U8 *)0x0) && (this->bytes != (U8 *)0x0)) {
    operator_delete__(this->bytes);
  }
  LASreadItemCompressed::~LASreadItemCompressed(&this->super_LASreadItemCompressed);
  return;
}

Assistant:

LASreadItemCompressed_WAVEPACKET14_v3::~LASreadItemCompressed_WAVEPACKET14_v3()
{
  /* destroy all initialized scanner channel contexts */

  U32 c;
  for (c = 0; c < 4; c++)
  {
    if (contexts[c].m_packet_index)
    {
      dec_wavepacket->destroySymbolModel(contexts[c].m_packet_index);
      dec_wavepacket->destroySymbolModel(contexts[c].m_offset_diff[0]);
      dec_wavepacket->destroySymbolModel(contexts[c].m_offset_diff[1]);
      dec_wavepacket->destroySymbolModel(contexts[c].m_offset_diff[2]);
      dec_wavepacket->destroySymbolModel(contexts[c].m_offset_diff[3]);
      delete contexts[c].ic_offset_diff;
      delete contexts[c].ic_packet_size;
      delete contexts[c].ic_return_point;
      delete contexts[c].ic_xyz;
    }
  }

  /* destroy all instreams and decoders */

  if (instream_wavepacket)
  {
    delete instream_wavepacket;

    delete dec_wavepacket;
  }

  if (bytes) delete [] bytes;
}